

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caseconvert.cpp
# Opt level: O3

string_t __thiscall
duckdb::CaseConvertOperator<false>::Operation<duckdb::string_t,duckdb::string_t>
          (CaseConvertOperator<false> *this,string_t input,Vector *result)

{
  Vector *vector;
  ulong uVar1;
  idx_t len;
  char *result_data;
  char *input_data;
  string_t sVar2;
  undefined1 local_38 [16];
  undefined8 local_28;
  char *local_20;
  
  local_20 = input.value._0_8_;
  input_data = (char *)((long)&local_28 + 4);
  if (0xc < (uint)this) {
    input_data = local_20;
  }
  local_28 = this;
  vector = (Vector *)GetResultLength<false>(input_data,(ulong)this & 0xffffffff);
  local_38 = (undefined1  [16])StringVector::EmptyString(input.value._8_8_,vector,len);
  result_data = local_38._8_8_;
  if (local_38._0_4_ < 0xd) {
    result_data = local_38 + 4;
  }
  CaseConvert<false>(input_data,(ulong)this & 0xffffffff,result_data);
  uVar1 = (ulong)(uint)local_38._0_4_;
  if (uVar1 < 0xd) {
    switchD_00569a20::default(local_38 + 4 + uVar1,0,0xc - uVar1);
  }
  else {
    local_38._4_4_ = *(undefined4 *)local_38._8_8_;
  }
  sVar2.value.pointer.ptr = (char *)local_38._8_8_;
  sVar2.value._0_8_ = local_38._0_8_;
  return (string_t)sVar2.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto input_data = input.GetData();
		auto input_length = input.GetSize();
		return UnicodeCaseConvert<IS_UPPER>(result, input_data, input_length);
	}